

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

void __thiscall CRegexStack::CRegexStack(CRegexStack *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  in_RDI[1] = 0x2000;
  pvVar1 = malloc(in_RDI[1]);
  *in_RDI = pvVar1;
  *(undefined4 *)(in_RDI + 2) = 0xffffffff;
  in_RDI[3] = 0;
  return;
}

Assistant:

CRegexStack()
    {
        /* allocate the initial state buffer */
        bufsiz_ = 8192;
        buf_ = (char *)t3malloc(bufsiz_);

        /* we don't have anything on the stack yet */
        sp_ = -1;
        used_ = 0;
    }